

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::SetModuleVariables(cmFindPackageCommand *this,string *components)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *pcVar1;
  ulong uVar2;
  char *local_1f8;
  undefined1 local_1d8 [8];
  string exact;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char local_118 [8];
  char buf [64];
  undefined1 local_d0 [8];
  string ver;
  string req;
  string quietly;
  string components_var;
  allocator local_39;
  string local_38;
  string *local_18;
  string *components_local;
  cmFindPackageCommand *this_local;
  
  local_18 = components;
  components_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_FIND_PACKAGE_NAME",&local_39);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  AddFindDefinition(this,&local_38,pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&quietly.field_2 + 8);
  std::operator+(__return_storage_ptr__,&this->Name,"_FIND_COMPONENTS");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  AddFindDefinition(this,__return_storage_ptr__,pcVar1);
  if ((this->Quiet & 1U) != 0) {
    std::__cxx11::string::string((string *)(req.field_2._M_local_buf + 8),(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)(req.field_2._M_local_buf + 8),"_FIND_QUIETLY");
    AddFindDefinition(this,(string *)((long)&req.field_2 + 8),"1");
    std::__cxx11::string::~string((string *)(req.field_2._M_local_buf + 8));
  }
  if ((this->Required & 1U) != 0) {
    std::__cxx11::string::string((string *)(ver.field_2._M_local_buf + 8),(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)(ver.field_2._M_local_buf + 8),"_FIND_REQUIRED");
    AddFindDefinition(this,(string *)((long)&ver.field_2 + 8),"1");
    std::__cxx11::string::~string((string *)(ver.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_d0,(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)local_d0,"_FIND_VERSION");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    AddFindDefinition(this,(string *)local_d0,pcVar1);
    sprintf(local_118,"%u",(ulong)this->VersionMajor);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "_MAJOR");
    AddFindDefinition(this,&local_138,local_118);
    std::__cxx11::string::~string((string *)&local_138);
    sprintf(local_118,"%u",(ulong)this->VersionMinor);
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "_MINOR");
    AddFindDefinition(this,&local_158,local_118);
    std::__cxx11::string::~string((string *)&local_158);
    sprintf(local_118,"%u",(ulong)this->VersionPatch);
    std::operator+(&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "_PATCH");
    AddFindDefinition(this,&local_178,local_118);
    std::__cxx11::string::~string((string *)&local_178);
    sprintf(local_118,"%u",(ulong)this->VersionTweak);
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "_TWEAK");
    AddFindDefinition(this,&local_198,local_118);
    std::__cxx11::string::~string((string *)&local_198);
    sprintf(local_118,"%u",(ulong)this->VersionCount);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&exact.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "_COUNT");
    AddFindDefinition(this,(string *)((long)&exact.field_2 + 8),local_118);
    std::__cxx11::string::~string((string *)(exact.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_1d8,(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)local_1d8,"_FIND_VERSION_EXACT");
    if ((this->VersionExact & 1U) == 0) {
      local_1f8 = "0";
    }
    else {
      local_1f8 = "1";
    }
    AddFindDefinition(this,(string *)local_1d8,local_1f8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack,
              &this->Name);
  std::__cxx11::string::~string((string *)(quietly.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(const std::string& components)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name.c_str());

  // Store the list of components.
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components.c_str());

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = this->Name;
    quietly += "_FIND_QUIETLY";
    this->AddFindDefinition(quietly, "1");
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = this->Name;
    req += "_FIND_REQUIRED";
    this->AddFindDefinition(req, "1");
  }

  if (!this->Version.empty()) {
    // Tell the module that is about to be read what version of the
    // package has been requested.
    std::string ver = this->Name;
    ver += "_FIND_VERSION";
    this->AddFindDefinition(ver, this->Version.c_str());
    char buf[64];
    sprintf(buf, "%u", this->VersionMajor);
    this->AddFindDefinition(ver + "_MAJOR", buf);
    sprintf(buf, "%u", this->VersionMinor);
    this->AddFindDefinition(ver + "_MINOR", buf);
    sprintf(buf, "%u", this->VersionPatch);
    this->AddFindDefinition(ver + "_PATCH", buf);
    sprintf(buf, "%u", this->VersionTweak);
    this->AddFindDefinition(ver + "_TWEAK", buf);
    sprintf(buf, "%u", this->VersionCount);
    this->AddFindDefinition(ver + "_COUNT", buf);

    // Tell the module whether an exact version has been requested.
    std::string exact = this->Name;
    exact += "_FIND_VERSION_EXACT";
    this->AddFindDefinition(exact, this->VersionExact ? "1" : "0");
  }

  // Push on to the pacakge stack
  this->Makefile->FindPackageModuleStack.push_back(this->Name);
}